

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc stbi__get_marker(stbi__jpeg *j)

{
  stbi_uc sVar1;
  long in_RDI;
  stbi_uc x;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  undefined1 local_1;
  
  if (*(char *)(in_RDI + 0x4728) == -1) {
    sVar1 = stbi__get8((stbi__context *)
                       CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    if (sVar1 == 0xff) {
      local_1 = 0xff;
      while (local_1 == 0xff) {
        local_1 = stbi__get8((stbi__context *)CONCAT17(0xff,in_stack_ffffffffffffffe8));
      }
    }
    else {
      local_1 = 0xff;
    }
  }
  else {
    local_1 = *(stbi_uc *)(in_RDI + 0x4728);
    *(undefined1 *)(in_RDI + 0x4728) = 0xff;
  }
  return local_1;
}

Assistant:

static stbi_uc stbi__get_marker(stbi__jpeg *j)
{
   stbi_uc x;
   if (j->marker != STBI__MARKER_none) { x = j->marker; j->marker = STBI__MARKER_none; return x; }
   x = stbi__get8(j->s);
   if (x != 0xff) return STBI__MARKER_none;
   while (x == 0xff)
      x = stbi__get8(j->s);
   return x;
}